

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  element_type *peVar1;
  pointer pcVar2;
  test_fixture *this;
  pointer psVar3;
  char *pcVar4;
  long *plVar5;
  bool bVar6;
  int iVar7;
  pointer psVar8;
  bool bVar9;
  string fixture_name;
  long *local_70;
  char *local_68;
  long local_60 [2];
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  std::set_terminate(handle_terminate);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
  pcVar4 = local_68;
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar4,(ulong)__s);
  }
  psVar3 = _test_fixtures.
           super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_test_fixtures.
      super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      _test_fixtures.
      super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00103b60:
    puts("\nSuccess.");
  }
  else {
    bVar6 = false;
    psVar8 = _test_fixtures.
             super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      while (local_68 != (char *)0x0) {
        peVar1 = (psVar8->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pcVar2 = (peVar1->_fixture_name)._M_dataplus._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (peVar1->_fixture_name)._M_string_length);
        plVar5 = local_50;
        if (local_48 == local_68) {
          if (local_48 == (char *)0x0) {
            bVar9 = false;
          }
          else {
            iVar7 = bcmp(local_50,local_70,(size_t)local_48);
            bVar9 = iVar7 != 0;
          }
        }
        else {
          bVar9 = true;
        }
        if (plVar5 != local_40) {
          operator_delete(plVar5,local_40[0] + 1);
        }
        if (!bVar9) break;
LAB_00103b1a:
        psVar8 = psVar8 + 1;
        if (psVar8 == psVar3) {
          if (!bVar6) goto LAB_00103b60;
          goto LAB_00103b46;
        }
      }
      test_fixture::run_tests
                ((psVar8->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      this = (psVar8->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this->_something_failed != true) goto LAB_00103b1a;
      test_fixture::print_failures(this);
      psVar8 = psVar8 + 1;
      bVar6 = true;
    } while (psVar8 != psVar3);
LAB_00103b46:
    puts("\nFailure.");
    system("/bin/bash -c \'read -p \"Press Any Key\"\'");
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
    set_terminate( handle_terminate );

    std::string fixture_name = "";

    if( argc > 1 )
        fixture_name = argv[1];

#ifdef IS_WINDOWS
    srand( (unsigned int)GetSystemTimeAsUnixTime() );
#endif
#ifdef IS_LINUX
    srand( time(0) );
#endif

    bool something_failed = false;

    for(auto& tf : _test_fixtures)
    {
        if( !fixture_name.empty() )
            if(tf->get_name() != fixture_name )
                continue;

        tf->run_tests();

        if( tf->something_failed() )
        {
            something_failed = true;
            tf->print_failures();
        }
    }

    if( !something_failed )
        printf("\nSuccess.\n");
    else printf("\nFailure.\n");

    if(something_failed)
        system("/bin/bash -c 'read -p \"Press Any Key\"'");

    return 0;
}